

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O3

void __thiscall
iutest::detail::iuValuesInParamsGenerator<std::tuple<bool,int>>::
iuValuesInParamsGenerator<std::tuple<bool,int>,1ul>
          (iuValuesInParamsGenerator<std::tuple<bool,int>> *this,tuple<bool,_int> (*values) [1])

{
  *(undefined ***)this = &PTR__iuValuesInParamsGenerator_003a1878;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  std::vector<std::tuple<bool,int>,std::allocator<std::tuple<bool,int>>>::
  _M_range_insert<std::tuple<bool,int>const*>
            ((vector<std::tuple<bool,int>,std::allocator<std::tuple<bool,int>>> *)(this + 8),0,
             values,values + 1);
  return;
}

Assistant:

explicit iuValuesInParamsGenerator(const TT (&values)[SIZE])
    {
        m_values.insert(m_values.end(), values, values + SIZE);
    }